

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_cluster.cpp
# Opt level: O0

void __thiscall argparse::args_t::parse_cluster(args_t *this,char *str)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  
  iVar1 = strcmp(in_RSI,"all");
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 0x14) = 0;
  }
  else {
    iVar1 = strcmp(in_RSI,"any");
    if (iVar1 == 0) {
      *(undefined4 *)(in_RDI + 0x14) = 1;
    }
    else {
      ERROR("invalid cluster construction mode type: %s",in_RSI);
    }
  }
  return;
}

Assistant:

void args_t::parse_cluster( const char * str ) {
        if (!strcmp (str, "all")) {
            cluster_type = all;
        } else if (!strcmp (str, "any")) {
            cluster_type = any;
        } else  {
            ERROR( "invalid cluster construction mode type: %s", str );
        }
    }